

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

FSerializer *
Serialize<zone_t,zone_t>
          (FSerializer *arc,char *key,TArray<zone_t,_zone_t> *value,TArray<zone_t,_zone_t> *param_4)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  zone_t *z;
  uint local_38;
  uint i;
  bool res;
  TArray<zone_t,_zone_t> *param_3_local;
  TArray<zone_t,_zone_t> *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if ((!bVar1) || (uVar3 = TArray<zone_t,_zone_t>::Size(value), uVar3 != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    bVar2 = FSerializer::isReading(arc);
    if (bVar2) {
      if (!bVar1) {
        TArray<zone_t,_zone_t>::Clear(value);
        return arc;
      }
      uVar3 = FSerializer::ArraySize(arc);
      TArray<zone_t,_zone_t>::Resize(value,uVar3);
    }
    for (local_38 = 0; uVar3 = TArray<zone_t,_zone_t>::Size(value), local_38 < uVar3;
        local_38 = local_38 + 1) {
      z = TArray<zone_t,_zone_t>::operator[](value,(ulong)local_38);
      Serialize(arc,(char *)0x0,z,(zone_t *)0x0);
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}